

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExpressionWithPrecedenceCast(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  Backtracker *pBVar4;
  ostream *poVar5;
  IndexType extKwTkIdx;
  undefined1 local_88 [8];
  Backtracker BT;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)expr;
  pSVar3 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar3);
  if (SVar2 == OpenParenToken) {
    pSVar3 = peek(this,2);
    SVar2 = SyntaxToken::kind(pSVar3);
    switch(SVar2) {
    case IdentifierToken:
      Backtracker::Backtracker((Backtracker *)local_88,this,0);
      bVar1 = parseCompoundLiteralOrCastExpression_AtFirst
                        (this,(ExpressionSyntax **)
                              BT.chained_.c.
                              super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node);
      if (bVar1) {
        SVar2 = C::SyntaxNode::kind((SyntaxNode *)
                                    *BT.chained_.c.
                                     super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
        if (SVar2 == CastExpression) {
          maybeAmbiguateCastExpression
                    (this,(ExpressionSyntax **)
                          BT.chained_.c.
                          super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node);
        }
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        Backtracker::backtrack((Backtracker *)local_88);
        bVar1 = false;
      }
      Backtracker::~Backtracker((Backtracker *)local_88);
      if (bVar1) break;
    default:
      this_local._7_1_ =
           parseExpressionWithPrecedenceUnary
                     (this,(ExpressionSyntax **)
                           BT.chained_.c.
                           super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      break;
    case Keyword_char:
    case KeywordAlias___const:
    case Keyword_double:
    case Keyword_enum:
    case Keyword_float:
    case Keyword_int:
    case Keyword_long:
    case KeywordAlias___restrict:
    case Keyword_short:
    case KeywordAlias___signed:
    case Keyword_struct:
    case Keyword_union:
    case Keyword_unsigned:
    case Keyword_void:
    case ENDof_KeywordOrPunctuatorToken:
    case Keyword_Ext_wchar_t:
    case KeywordAlias_Bool:
    case Keyword__Complex:
    case KeywordAlias___alignas:
    case Keyword__Atomic:
    case Keyword_Ext_char16_t:
    case Keyword_Ext_char32_t:
    case KeywordAlias___typeof:
    case Keyword_ExtGNU___complex__:
      this_local._7_1_ =
           parseCompoundLiteralOrCastExpression_AtFirst
                     (this,(ExpressionSyntax **)
                           BT.chained_.c.
                           super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
    }
  }
  else if (SVar2 == Keyword_ExtGNU___extension__) {
    pBVar4 = (Backtracker *)consume(this);
    bVar1 = parseExpressionWithPrecedenceCast
                      (this,(ExpressionSyntax **)
                            BT.chained_.c.
                            super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (bVar1) {
      if (*BT.chained_.c.
           super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node == (Backtracker **)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x478);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,"invalid expression");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
      }
      else {
        (*BT.chained_.c.
          super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node)[4] = pBVar4;
        this_local._7_1_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ =
         parseExpressionWithPrecedenceUnary
                   (this,(ExpressionSyntax **)
                         BT.chained_.c.
                         super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::parseExpressionWithPrecedenceCast(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            // cast-expression -> unary-expression ->* `(' expression `)'
            //                  | `(' type-name `)' cast-expression
            switch (peek(2).kind()) {
                // type-name ->* type-qualifier
                case SyntaxKind::Keyword_const:
                case SyntaxKind::Keyword_volatile:
                case SyntaxKind::Keyword_restrict:
                case SyntaxKind::Keyword__Atomic:

                // type-name ->* alignment-specifier
                case SyntaxKind::Keyword__Alignas:

                // type-name ->* GNU-typeof-specifier ->
                case SyntaxKind::Keyword_ExtGNU___typeof__:

                // // type-name ->* type-specifier
                case SyntaxKind::Keyword_void:
                case SyntaxKind::Keyword_char:
                case SyntaxKind::Keyword_short:
                case SyntaxKind::Keyword_int:
                case SyntaxKind::Keyword_long:
                case SyntaxKind::Keyword_float:
                case SyntaxKind::Keyword_double:
                case SyntaxKind::Keyword__Bool:
                case SyntaxKind::Keyword__Complex:
                case SyntaxKind::Keyword_signed:
                case SyntaxKind::Keyword_unsigned:
                case SyntaxKind::Keyword_Ext_char16_t:
                case SyntaxKind::Keyword_Ext_char32_t:
                case SyntaxKind::Keyword_Ext_wchar_t:
                case SyntaxKind::Keyword_struct:
                case SyntaxKind::Keyword_union:
                case SyntaxKind::Keyword_enum:
                case SyntaxKind::Keyword_ExtGNU___complex__:
                    return parseCompoundLiteralOrCastExpression_AtFirst(expr);

                // type-name ->* typedef-name -> identifier
                // expression ->* identifier
                case SyntaxKind::IdentifierToken: {
                    Backtracker BT(this);
                    if (parseCompoundLiteralOrCastExpression_AtFirst(expr)) {
                        if (expr->kind() == SyntaxKind::CastExpression)
                            maybeAmbiguateCastExpression(expr);
                        return true;
                    }
                    BT.backtrack();
                    [[fallthrough]];
                }

                default:
                    return parseExpressionWithPrecedenceUnary(expr);
            }
        }

        case SyntaxKind::Keyword_ExtGNU___extension__: {
            auto extKwTkIdx = consume();
            if (!parseExpressionWithPrecedenceCast(expr))
                return false;
            PSY_ASSERT_3(expr, return false, "invalid expression");
            expr->extKwTkIdx_ = extKwTkIdx;
            return true;
        }

        default:
            return parseExpressionWithPrecedenceUnary(expr);
    }
}